

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
         *this)

{
  FloatFormat *pFVar1;
  ostringstream *poVar2;
  ostringstream *this_00;
  ostream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_01;
  size_t sVar5;
  TestLog *pTVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  bool bVar9;
  int iVar10;
  MessageBuilder *pMVar11;
  undefined8 uVar12;
  IVal *pIVar13;
  _Rb_tree_node_base *p_Var14;
  TestStatus *__return_storage_ptr___00;
  bool bVar15;
  int numErrors;
  IVal in2;
  FloatFormat highpFmt;
  IVal in3;
  void *outputArr [2];
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  outputs;
  void *inputArr [4];
  FuncSet funcs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ResultCollector status;
  IVal in0;
  IVal in1;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff7d8;
  long lVar16;
  int local_804;
  size_t local_800;
  TestStatus *local_7f8;
  FloatFormat *local_7f0;
  string local_7e8;
  FloatFormat local_7c8;
  size_t local_7a0;
  string local_798;
  pointer local_778;
  _Base_ptr local_770;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_768;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  local_738;
  pointer local_708;
  pointer local_700;
  pointer local_6f8;
  pointer local_6f0;
  undefined1 local_6e8 [12];
  YesNoMaybe YStack_6dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  _Rb_tree_node_base *local_6c8;
  double local_6c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_6b8;
  undefined4 local_6b0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_560;
  ResultCollector local_500;
  MessageBuilder local_4b0;
  IVal local_330;
  MessageBuilder local_1b0;
  
  this_01 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_7f8 = __return_storage_ptr__;
  iVar10 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_7f0 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_560,(shaderexecutor *)this_01,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar4,(Precision)sVar5,(ulong)(iVar10 + 0xdeadbeef),
             in_stack_fffffffffffff7d8);
  local_800 = (long)local_560.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_560.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>::
  Outputs(&local_738,local_800);
  local_7c8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_7c8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_7c8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_7c8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_7c8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_7c8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_7c8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_7c8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_7c8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_804 = 0;
  local_768._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_768._M_impl.super__Rb_tree_header._M_header;
  local_768._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_768._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_768._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_768._M_impl.super__Rb_tree_header._M_header._M_right =
       local_768._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_500);
  pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_708 = local_560.in0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_700 = local_560.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_6f8 = local_560.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_6f0 = local_560.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_778 = local_738.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_770 = (_Base_ptr)
              local_738.out1.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = &local_4b0.m_str;
  local_4b0.m_log = pTVar6;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<((ostream *)poVar2,"Statement: ");
  pMVar11 = tcu::MessageBuilder::operator<<(&local_4b0,&this->m_stmt);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  p_Var14 = (_Rb_tree_node_base *)(local_6e8 + 8);
  local_6e8._8_4_ = _S_red;
  local_6d8._M_allocated_capacity = 0;
  local_6c0 = 0.0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_6d8._8_8_ = p_Var14;
  local_6c8 = p_Var14;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_6e8);
  for (uVar12 = local_6d8._8_8_; (_Rb_tree_node_base *)uVar12 != p_Var14;
      uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
    (**(code **)(**(long **)(uVar12 + 0x20) + 0x30))(*(long **)(uVar12 + 0x20),&local_1b0);
  }
  if (local_6c0 != 0.0) {
    poVar2 = &local_4b0.m_str;
    local_4b0.m_log = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar2,(string *)&local_330);
    tcu::MessageBuilder::operator<<(&local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_6e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  p_Var14 = (_Rb_tree_node_base *)&local_778;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,local_800,&local_708,p_Var14,0);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)&local_4b0);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)&local_1b0);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_6e8);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_768,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)&local_4b0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_768,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_330);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_768,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_7e8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_768,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_798);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_768,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)&local_1b0);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_768,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_6e8);
  lVar16 = 0;
  local_7a0 = local_800;
  iVar10 = 0;
  while( true ) {
    bVar15 = local_7a0 == 0;
    local_7a0 = local_7a0 - 1;
    if (bVar15) break;
    tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)&local_4b0);
    tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)&local_1b0);
    pFVar1 = local_7f0;
    round<tcu::Matrix<float,4,4>>
              (&local_330,(shaderexecutor *)local_7f0,
               (FloatFormat *)
               ((long)((local_560.in0.
                        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar16),(Matrix<float,_4,_4> *)p_Var14);
    ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
              ((IVal *)local_6e8,pFVar1,&local_330);
    pIVar13 = Environment::lookup<tcu::Matrix<float,4,4>>
                        ((Environment *)&local_768,
                         (this->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                         .m_ptr);
    tcu::Matrix<tcu::Interval,_4,_4>::operator=(pIVar13,(Matrix<tcu::Interval,_4,_4> *)local_6e8);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_768,
               (this->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_768,
               (this->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_768,
               (this->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    p_Var14 = (_Rb_tree_node_base *)local_7f0->m_maxValue;
    local_6e8._0_8_ = *(undefined8 *)local_7f0;
    local_6e8._8_4_ = local_7f0->m_fractionBits;
    YStack_6dc = local_7f0->m_hasSubnormal;
    local_6d8._M_allocated_capacity = *(undefined8 *)&local_7f0->m_hasInf;
    local_6d8._8_8_ = *(undefined8 *)&local_7f0->m_exactPrecision;
    local_6c0 = (double)CONCAT44(local_6c0._4_4_,(this->m_caseCtx).precision);
    local_6b0 = 0;
    pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_6c8 = p_Var14;
    local_6b8 = &local_768;
    (*pSVar7->_vptr_Statement[3])(pSVar7,(MessageBuilder *)local_6e8);
    pIVar13 = Environment::lookup<tcu::Matrix<float,4,4>>
                        ((Environment *)&local_768,
                         (this->m_variables).out1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
              ((IVal *)local_6e8,&local_7c8,pIVar13);
    tcu::Matrix<tcu::Interval,_4,_4>::operator=
              ((Matrix<tcu::Interval,_4,_4> *)&local_1b0,(Matrix<tcu::Interval,_4,_4> *)local_6e8);
    bVar15 = ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::
             doContains((IVal *)&local_1b0,
                        (Matrix<float,_4,_4> *)
                        ((long)((local_738.out1.
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + lVar16));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_6e8,"Shader output 1 is outside acceptable range",
               (allocator<char> *)&local_330);
    bVar15 = tcu::ResultCollector::check(&local_500,bVar15,(string *)local_6e8);
    std::__cxx11::string::~string((string *)local_6e8);
    pIVar13 = Environment::lookup<tcu::Matrix<float,4,4>>
                        ((Environment *)&local_768,
                         (this->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
              ((IVal *)local_6e8,&local_7c8,pIVar13);
    tcu::Matrix<tcu::Interval,_4,_4>::operator=
              ((Matrix<tcu::Interval,_4,_4> *)&local_4b0,(Matrix<tcu::Interval,_4,_4> *)local_6e8);
    bVar9 = ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doContains
                      ((IVal *)&local_4b0,
                       (Matrix<float,_4,_4> *)
                       ((long)((local_738.out0.
                                super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data
                       + lVar16));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_6e8,"Shader output 0 is outside acceptable range",
               (allocator<char> *)&local_330);
    bVar9 = tcu::ResultCollector::check(&local_500,bVar9,(string *)local_6e8);
    std::__cxx11::string::~string((string *)local_6e8);
    if (!bVar15 || !bVar9) {
      iVar10 = iVar10 + 1;
      local_804 = iVar10;
      if (iVar10 < 0x65) {
        this_00 = (ostringstream *)(local_6e8 + 8);
        local_6e8._0_8_ = pTVar6;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Failed");
        std::operator<<((ostream *)this_00," sample:\n");
        std::operator<<((ostream *)this_00,"\t");
        std::__cxx11::string::string
                  ((string *)&local_330,
                   (string *)
                   &((this->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_6e8 + 8),(string *)&local_330);
        std::operator<<((ostream *)(local_6e8 + 8)," = ");
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_7e8,(shaderexecutor *)&local_7c8,
                   (FloatFormat *)
                   ((long)((local_560.in0.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar16),(Matrix<float,_4,_4> *)p_Var14);
        poVar3 = (ostream *)(local_6e8 + 8);
        std::operator<<(poVar3,(string *)&local_7e8);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_330);
        std::operator<<(poVar3,"\t");
        std::__cxx11::string::string
                  ((string *)&local_330,
                   (string *)
                   &((this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_6e8 + 8),(string *)&local_330);
        std::operator<<((ostream *)(local_6e8 + 8)," = ");
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_7e8,(shaderexecutor *)&local_7c8,
                   (FloatFormat *)
                   ((long)((local_738.out0.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar16),(Matrix<float,_4,_4> *)p_Var14);
        poVar3 = (ostream *)(local_6e8 + 8);
        std::operator<<(poVar3,(string *)&local_7e8);
        std::operator<<(poVar3,"\n");
        std::operator<<(poVar3,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_798,(shaderexecutor *)&local_7c8,(FloatFormat *)&local_4b0,(IVal *)p_Var14
                  );
        poVar3 = (ostream *)(local_6e8 + 8);
        std::operator<<(poVar3,(string *)&local_798);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_798);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_330);
        std::operator<<(poVar3,"\t");
        std::__cxx11::string::string
                  ((string *)&local_330,
                   (string *)
                   &((this->m_variables).out1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_6e8 + 8),(string *)&local_330);
        std::operator<<((ostream *)(local_6e8 + 8)," = ");
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_7e8,(shaderexecutor *)&local_7c8,
                   (FloatFormat *)
                   ((long)((local_738.out1.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar16),(Matrix<float,_4,_4> *)p_Var14);
        poVar3 = (ostream *)(local_6e8 + 8);
        std::operator<<(poVar3,(string *)&local_7e8);
        std::operator<<(poVar3,"\n");
        std::operator<<(poVar3,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_798,(shaderexecutor *)&local_7c8,(FloatFormat *)&local_1b0,(IVal *)p_Var14
                  );
        poVar3 = (ostream *)(local_6e8 + 8);
        std::operator<<(poVar3,(string *)&local_798);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_798);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_330);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      }
    }
    lVar16 = lVar16 + 0x40;
  }
  if (iVar10 < 0x65) {
    if (iVar10 == 0) {
      poVar2 = &local_4b0.m_str;
      local_4b0.m_log = pTVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<((ostream *)poVar2," inputs passed.");
      tcu::MessageBuilder::operator<<(&local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"Pass",(allocator<char> *)&local_1b0);
      __return_storage_ptr___00 = local_7f8;
      tcu::TestStatus::pass(local_7f8,(string *)&local_4b0);
      pMVar11 = &local_4b0;
      goto LAB_00841bf5;
    }
  }
  else {
    poVar2 = &local_4b0.m_str;
    local_4b0.m_log = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"(Skipped ");
    std::ostream::operator<<(poVar2,iVar10 + -100);
    std::operator<<((ostream *)poVar2," messages.)");
    tcu::MessageBuilder::operator<<(&local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  }
  poVar2 = &local_4b0.m_str;
  local_4b0.m_log = pTVar6;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::ostream::operator<<(poVar2,iVar10);
  std::operator<<((ostream *)poVar2,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<((ostream *)poVar2," inputs failed.");
  tcu::MessageBuilder::operator<<(&local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  de::toString<int>((string *)&local_1b0,&local_804);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6e8," test failed. Check log for the details",
             (allocator<char> *)&local_330);
  __return_storage_ptr___00 = local_7f8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)local_6e8);
  pMVar11 = &local_1b0;
LAB_00841bf5:
  std::__cxx11::string::~string((string *)pMVar11);
  tcu::ResultCollector::~ResultCollector(&local_500);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_768);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>::
  ~Outputs(&local_738);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_560);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}